

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::addBlock(BaseRAPass *this,RABlock *block)

{
  Error EVar1;
  RABlock *block_local;
  
  block_local = block;
  EVar1 = ZoneVector<asmjit::v1_14::RABlock_*>::willGrow(&this->_blocks,&this->_allocator,1);
  if (EVar1 == 0) {
    *(undefined4 *)(block + 8) = *(undefined4 *)&this->field_0xb8;
    ZoneVector<asmjit::v1_14::RABlock_*>::appendUnsafe(&this->_blocks,&block_local);
  }
  return EVar1;
}

Assistant:

Error BaseRAPass::addBlock(RABlock* block) noexcept {
  ASMJIT_PROPAGATE(_blocks.willGrow(allocator()));

  block->_blockId = blockCount();
  _blocks.appendUnsafe(block);
  return kErrorOk;
}